

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O0

bool __thiscall
irr::io::CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase>::parseCDATA
          (CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this)

{
  string<unsigned_short> local_40;
  unsigned_short *local_30;
  unsigned_short *cDataEnd;
  unsigned_short *cDataBegin;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *pCStack_18;
  int count;
  CXMLReaderImpl<unsigned_short,_irr::io::IXMLBase> *this_local;
  
  if (this->P[1] == 0x5b) {
    this->CurrentNodeType = EXN_CDATA;
    for (cDataBegin._4_4_ = 0; *this->P != 0 && cDataBegin._4_4_ < 8;
        cDataBegin._4_4_ = cDataBegin._4_4_ + 1) {
      this->P = this->P + 1;
    }
    if (*this->P == 0) {
      this_local._7_1_ = true;
    }
    else {
      cDataEnd = this->P;
      local_30 = (unsigned_short *)0x0;
      while (*this->P != 0 && local_30 == (unsigned_short *)0x0) {
        if (((*this->P == 0x3e) && (this->P[-1] == 0x5d)) && (this->P[-2] == 0x5d)) {
          local_30 = this->P + -2;
        }
        this->P = this->P + 1;
      }
      pCStack_18 = this;
      if (local_30 == (unsigned_short *)0x0) {
        core::string<unsigned_short>::operator=(&this->NodeName,"");
      }
      else {
        core::string<unsigned_short>::string<unsigned_short>
                  (&local_40,cDataEnd,(s32)((ulong)((long)local_30 - (long)cDataEnd) >> 1));
        core::string<unsigned_short>::operator=(&this->NodeName,&local_40);
        core::string<unsigned_short>::~string(&local_40);
      }
      this_local._7_1_ = true;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool parseCDATA()
	{
		if (*(P+1) != L'[')
			return false;

		CurrentNodeType = EXN_CDATA;

		// skip '<![CDATA['
		int count=0;
		while( *P && count<8 )
		{
			++P;
			++count;
		}

		if (!*P)
			return true;

		char_type *cDataBegin = P;
		char_type *cDataEnd = 0;

		// find end of CDATA
		while(*P && !cDataEnd)
		{
			if (*P == L'>' && 
			   (*(P-1) == L']') &&
			   (*(P-2) == L']'))
			{
				cDataEnd = P - 2;
			}

			++P;
		}

		if ( cDataEnd )
			NodeName = core::string<char_type>(cDataBegin, (int)(cDataEnd - cDataBegin));
		else
			NodeName = "";

		return true;
	}